

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ListFile.cpp
# Opt level: O3

void * ListFile_FromBuffer(LPBYTE pbBuffer,DWORD cbBuffer)

{
  undefined8 *__dest;
  ulong __n;
  undefined8 *puVar1;
  
  __n = (ulong)cbBuffer;
  puVar1 = (undefined8 *)malloc(__n + 0x18);
  if (puVar1 != (undefined8 *)0x0) {
    __dest = puVar1 + 3;
    puVar1[1] = __dest;
    *puVar1 = __dest;
    puVar1[2] = (long)puVar1 + __n + 0x18;
    memcpy(__dest,pbBuffer,__n);
  }
  return puVar1;
}

Assistant:

void * ListFile_FromBuffer(LPBYTE pbBuffer, DWORD cbBuffer)
{
    PLISTFILE_CACHE pCache = NULL;

    // Create the in-memory cache for the entire listfile
    // The listfile does not have any data loaded yet
    pCache = CreateListFileCache(cbBuffer);
    if(pCache != NULL)
        memcpy(pCache->pBegin, pbBuffer, cbBuffer);

    return pCache;
}